

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::print(VirtualMachine *this)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  element_type *peVar7;
  const_reference fn;
  value_type *pvVar8;
  const_reference this_00;
  reference pbVar9;
  Variable VVar10;
  Variable var;
  Variable var_00;
  ByteCode bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  value_type *obj;
  size_t i_5;
  size_t i_4;
  string local_100;
  ulong local_e0;
  size_t i_3;
  anon_union_8_6_52c89740_for_Variable_1 aStack_d0;
  string local_c8;
  ulong local_a8;
  size_t i_2;
  anon_union_8_6_52c89740_for_Variable_1 local_98;
  string local_90;
  ulong local_70;
  size_t i_1;
  ulong local_58;
  anon_union_8_6_52c89740_for_Variable_1 aStack_50;
  string local_48;
  ulong local_28;
  size_t i;
  element_type *peStack_18;
  int frameDepth;
  StackFrame *stackFrame;
  VirtualMachine *this_local;
  
  stackFrame = (StackFrame *)this;
  std::operator<<(this->out,"Stack Frames:\n");
  peStack_18 = std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->stackFrame).
                           super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>);
  i._4_4_ = 0;
  for (; peStack_18 != (element_type *)0x0;
      peStack_18 = std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(peStack_18->outer).
                               super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>))
  {
    poVar3 = std::operator<<(this->out,"| Stack Frame: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i._4_4_);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(this->out,"| | Program Counter: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,peStack_18->programCounter);
    std::operator<<(poVar3,'\n');
    std::operator<<(this->out,"| | Locals:\n");
    local_28 = 0;
    while( true ) {
      uVar1 = local_28;
      sVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                        (&peStack_18->locals);
      if (sVar4 <= uVar1) break;
      poVar3 = std::operator<<(this->out,"| |   |");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
      poVar3 = std::operator<<(poVar3,"| ");
      pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         (&peStack_18->locals,local_28);
      local_58 = *(ulong *)pvVar5;
      aStack_50 = (anon_union_8_6_52c89740_for_Variable_1)(pvVar5->field_1).integerValue;
      var._0_8_ = local_58 & 0xffffffff;
      var.field_1 = (anon_union_8_6_52c89740_for_Variable_1)
                    (anon_union_8_6_52c89740_for_Variable_1)aStack_50.integerValue;
      variableToString_abi_cxx11_(&local_48,this,var,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_48);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&local_48);
      local_28 = local_28 + 1;
    }
    std::operator<<(this->out,"| | Captures:\n");
    local_70 = 0;
    while( true ) {
      uVar1 = local_70;
      sVar4 = std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::size
                        (&peStack_18->function->captures);
      if (sVar4 <= uVar1) break;
      poVar3 = std::operator<<(this->out,"| |   |");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_70);
      poVar3 = std::operator<<(poVar3,"| ");
      VVar10 = loadClosureValue(this,peStack_18->function,local_70);
      local_98 = VVar10.field_1;
      i_2._0_4_ = VVar10.type;
      var_00._4_4_ = 0;
      var_00.type = (VariableType)i_2;
      var_00.field_1.integerValue = local_98.integerValue;
      variableToString_abi_cxx11_(&local_90,this,var_00,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_90);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&local_90);
      local_70 = local_70 + 1;
    }
    std::operator<<(this->out,"| | Op Stack:\n");
    local_a8 = 0;
    while( true ) {
      uVar1 = local_a8;
      sVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                        (&peStack_18->opStack);
      if (sVar4 <= uVar1) break;
      poVar3 = std::operator<<(this->out,"| |   |");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a8);
      poVar3 = std::operator<<(poVar3,"| ");
      pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         (&peStack_18->opStack,local_a8);
      i_3 = *(size_t *)pvVar5;
      aStack_d0 = (anon_union_8_6_52c89740_for_Variable_1)(pvVar5->field_1).integerValue;
      VVar10._0_8_ = i_3 & 0xffffffff;
      VVar10.field_1 =
           (anon_union_8_6_52c89740_for_Variable_1)
           (anon_union_8_6_52c89740_for_Variable_1)aStack_d0.integerValue;
      variableToString_abi_cxx11_(&local_c8,this,VVar10,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_c8);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&local_c8);
      local_a8 = local_a8 + 1;
    }
    std::operator<<(this->out,"| | Byte Code:\n");
    local_e0 = 0;
    while( true ) {
      uVar1 = local_e0;
      sVar4 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                        (&peStack_18->function->fn->byteCode);
      if (sVar4 <= uVar1) break;
      poVar3 = std::operator<<(this->out,"| |   |");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
      poVar3 = std::operator<<(poVar3,"| ");
      pvVar6 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                         (&peStack_18->function->fn->byteCode,local_e0);
      bc._0_8_ = *(ulong *)pvVar6 & 0xffffffff;
      bc.parameter = pvVar6->parameter;
      byteCodeToString_abi_cxx11_(&local_100,this,bc,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_100);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&local_100);
      local_e0 = local_e0 + 1;
    }
    std::operator<<(this->out,"| \\------------------\n");
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Entrypoint:\n");
  peVar7 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  printFunction(this,&peVar7->entrypoint);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Functions:\n");
  i_5 = 0;
  while( true ) {
    peVar7 = std::
             __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file);
    sVar4 = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::size
                      (&peVar7->functions);
    if (sVar4 <= i_5) break;
    poVar3 = std::operator<<(this->out,"| Function: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i_5);
    std::operator<<(poVar3,'\n');
    peVar7 = std::
             __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file);
    fn = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::at
                   (&peVar7->functions,i_5);
    printFunction(this,fn);
    i_5 = i_5 + 1;
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Object Constructors:\n");
  obj = (value_type *)0x0;
  while( true ) {
    peVar7 = std::
             __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file);
    pvVar8 = (value_type *)
             std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
             ::size(&peVar7->objects);
    if (pvVar8 <= obj) break;
    poVar3 = std::operator<<(this->out,"| |");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)obj);
    std::operator<<(poVar3,"| ");
    peVar7 = std::
             __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file);
    this_00 = std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
              ::at(&peVar7->objects,(size_type)obj);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this_00->keys);
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this_00->keys);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&key);
      if (!bVar2) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar3 = std::operator<<(this->out,(string *)pbVar9);
      std::operator<<(poVar3,", ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(this->out,'\n');
    obj = (value_type *)
          ((long)&(obj->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Integer Constants:\n");
  poVar3 = this->out;
  peVar7 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  printConstantArray<long>(poVar3,&peVar7->intConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Float Constants:\n");
  poVar3 = this->out;
  peVar7 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  printConstantArray<double>(poVar3,&peVar7->floatConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"String Constants:\n");
  poVar3 = this->out;
  peVar7 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  printConstantArray<std::__cxx11::string>(poVar3,&peVar7->stringConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void runtime::VirtualMachine::print() {
  this->out << "Stack Frames:\n";

  StackFrame* stackFrame = this->stackFrame.get();

  int frameDepth = 0;

  while (stackFrame != nullptr) {
    this->out << "| Stack Frame: " << frameDepth << '\n';
    this->out << "| | Program Counter: " << stackFrame->programCounter << '\n';
    this->out << "| | Locals:\n";
    for (std::size_t i = 0; i < stackFrame->locals.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->locals.at(i), false) << '\n';
    }
    this->out << "| | Captures:\n";
    for (std::size_t i = 0; i < stackFrame->function->captures.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(this->loadClosureValue(stackFrame->function, i), false) << '\n';
    }
    this->out << "| | Op Stack:\n";
    for (std::size_t i = 0; i < stackFrame->opStack.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->opStack.at(i), false) << '\n';
    }
    this->out << "| | Byte Code:\n";
    for (std::size_t i = 0; i < stackFrame->function->fn->byteCode.size(); i++) {
      this->out << "| |   |" << i << "| " << this->byteCodeToString(stackFrame->function->fn->byteCode.at(i), false) << '\n';
    }
    this->out << "| \\------------------\n";

    stackFrame = stackFrame->outer.get();
  }
  this->out << "\\------------------\n";

  this->out << "Entrypoint:\n";
  this->printFunction(&this->file->entrypoint);
  this->out << "\\------------------\n";

  this->out << "Functions:\n";
  for (std::size_t i = 0; i < this->file->functions.size(); i++) {
    this->out << "| Function: " << i << '\n';
    this->printFunction(&this->file->functions.at(i));
  }
  this->out << "\\------------------\n";

  this->out << "Object Constructors:\n";
  for (std::size_t i = 0; i < this->file->objects.size(); i++) {
    this->out << "| |" << i << "| ";
    const auto& obj = this->file->objects.at(i);
    for (const auto& key : obj.keys) {
      this->out << key << ", ";
    }
    this->out << '\n';
  }
  this->out << "\\------------------\n";

  this->out << "Integer Constants:\n";
  printConstantArray<std::int64_t>(this->out, this->file->intConstants);
  this->out << "\\------------------\n";

  this->out << "Float Constants:\n";
  printConstantArray<double>(this->out, this->file->floatConstants);
  this->out << "\\------------------\n";

  this->out << "String Constants:\n";
  printConstantArray<std::string>(this->out, this->file->stringConstants);
  this->out << "\\------------------\n";

  this->out << std::endl;
}